

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classarray.h
# Opt level: O1

ptrdiff_t __thiscall
soplex::
ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
::reMax(ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        *this,int newMax,int newSize)

{
  undefined4 *puVar1;
  undefined4 *puVar2;
  long lVar3;
  int *piVar4;
  uint n;
  undefined4 *puVar5;
  undefined4 *puVar6;
  ulong uVar7;
  long lVar8;
  ptrdiff_t pVar9;
  byte bVar10;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *newMem;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_28;
  
  bVar10 = 0;
  if (newSize < 0) {
    newSize = this->thesize;
  }
  if (newMax <= newSize) {
    newMax = newSize;
  }
  n = 1;
  if (1 < newMax) {
    n = newMax;
  }
  if (n == this->themax) {
    this->thesize = newSize;
    pVar9 = 0;
  }
  else {
    local_28 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)0x0;
    spx_alloc<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>*>
              (&local_28,n);
    uVar7 = 0;
    if ((0 < newSize) && (0 < this->thesize)) {
      lVar8 = 0x80;
      uVar7 = 0;
      do {
        puVar1 = (undefined4 *)((long)(local_28->val).m_backend.data._M_elems + lVar8);
        puVar2 = (undefined4 *)((long)(&this->data->val + -1) + lVar8);
        puVar5 = puVar2;
        puVar6 = puVar1 + -0x20;
        for (lVar3 = 0x1c; lVar3 != 0; lVar3 = lVar3 + -1) {
          *puVar6 = *puVar5;
          puVar5 = puVar5 + (ulong)bVar10 * -2 + 1;
          puVar6 = puVar6 + (ulong)bVar10 * -2 + 1;
        }
        puVar1[-4] = puVar2[0x1c];
        *(undefined1 *)(puVar1 + -3) = *(undefined1 *)(puVar2 + 0x1d);
        *(undefined8 *)(puVar1 + -2) = *(undefined8 *)(puVar2 + 0x1e);
        *puVar1 = puVar2[0x20];
        uVar7 = uVar7 + 1;
      } while ((uVar7 < (uint)newSize) && (lVar8 = lVar8 + 0x84, (long)uVar7 < (long)this->thesize))
      ;
    }
    if ((uint)uVar7 < n) {
      piVar4 = &local_28[uVar7 & 0xffffffff].idx;
      lVar8 = (ulong)n - (uVar7 & 0xffffffff);
      do {
        *(undefined8 *)(piVar4 + -2) = 0x1c00000000;
        (((Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)(piVar4 + -0x20))->val).m_backend.data._M_elems[0] = 0;
        (((Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)(piVar4 + -0x20))->val).m_backend.data._M_elems[1] = 0;
        (piVar4 + -0x1e)[0] = 0;
        (piVar4 + -0x1e)[1] = 0;
        (piVar4 + -0x1c)[0] = 0;
        (piVar4 + -0x1c)[1] = 0;
        (piVar4 + -0x1a)[0] = 0;
        (piVar4 + -0x1a)[1] = 0;
        (piVar4 + -0x18)[0] = 0;
        (piVar4 + -0x18)[1] = 0;
        (piVar4 + -0x16)[0] = 0;
        (piVar4 + -0x16)[1] = 0;
        (piVar4 + -0x14)[0] = 0;
        (piVar4 + -0x14)[1] = 0;
        (piVar4 + -0x12)[0] = 0;
        (piVar4 + -0x12)[1] = 0;
        (piVar4 + -0x10)[0] = 0;
        (piVar4 + -0x10)[1] = 0;
        (piVar4 + -0xe)[0] = 0;
        (piVar4 + -0xe)[1] = 0;
        (piVar4 + -0xc)[0] = 0;
        (piVar4 + -0xc)[1] = 0;
        (piVar4 + -10)[0] = 0;
        (piVar4 + -10)[1] = 0;
        (piVar4 + -8)[0] = 0;
        (piVar4 + -8)[1] = 0;
        (piVar4 + -6)[0] = 0;
        (piVar4 + -6)[1] = 0;
        *(undefined8 *)((long)piVar4 + -0x13) = 0;
        *piVar4 = 0;
        piVar4 = piVar4 + 0x21;
        lVar8 = lVar8 + -1;
      } while (lVar8 != 0);
    }
    pVar9 = (long)local_28 - (long)this->data;
    free(this->data);
    this->data = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)0x0;
    this->data = local_28;
    this->themax = n;
    this->thesize = newSize;
  }
  return pVar9;
}

Assistant:

ptrdiff_t reMax(int newMax = 1, int newSize = -1)
   {
      /* process input */
      if(newSize < 0)
         newSize = size();

      if(newMax < 1)
         newMax = 1;

      if(newMax < newSize)
         newMax = newSize;

      /* nothing to reallocate */
      if(newMax == themax)
      {
         thesize = newSize;
         return 0;
      }

      /* allocate new memory */
      T* newMem = nullptr;
      spx_alloc(newMem, newMax);

      /* call copy constructor for first elements */
      int i;

      for(i = 0; i < size() && i < newSize; i++)
         new(&(newMem[i])) T(data[i]);

      /* call default constructor for remaining elements */
      for(; i < newMax; i++)
         new(&(newMem[i])) T();

      /* compute pointer difference */
      ptrdiff_t pshift = reinterpret_cast<char*>(newMem) - reinterpret_cast<char*>(data);

      /* free old memory */
      for(i = themax - 1; i >= 0; i--)
         data[i].~T();

      spx_free(data);

      /* assign new memory */
      data = newMem;
      themax = newMax;
      thesize = newSize;

      return pshift;
   }